

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::ChooseMatrix(Codec *this,uint64_t message_bytes,uint block_bytes)

{
  uint16_t uVar1;
  uint in_EDX;
  long in_RSI;
  uint *in_RDI;
  uint unaff_retaddr;
  uint16_t unaff_retaddr_00;
  WirehairResult local_4;
  
  if ((in_RSI == 0) || (in_EDX == 0)) {
    local_4 = Wirehair_InvalidInput;
  }
  else {
    *in_RDI = in_EDX;
    *(short *)(in_RDI + 1) = (short)(((in_RSI + (ulong)*in_RDI) - 1) / (ulong)*in_RDI);
    uVar1 = NextPrime16(unaff_retaddr_00);
    *(uint16_t *)((long)in_RDI + 6) = uVar1;
    if ((ushort)in_RDI[1] < 2) {
      local_4 = Wirehair_BadInput_SmallN;
    }
    else if ((ushort)in_RDI[1] < 0xfa01) {
      if ((in_RDI[2] & 1) == 0) {
        uVar1 = GetDenseCount(unaff_retaddr);
        *(uint16_t *)((long)in_RDI + 10) = uVar1;
        uVar1 = GetDenseSeed((uint)(ushort)in_RDI[1],(uint)*(ushort *)((long)in_RDI + 10));
        in_RDI[4] = (uint)uVar1;
        uVar1 = GetPeelSeed((uint)(ushort)in_RDI[1]);
        in_RDI[3] = (uint)uVar1;
      }
      *(short *)(in_RDI + 6) = *(short *)((long)in_RDI + 10) + 6;
      uVar1 = NextPrime16(unaff_retaddr_00);
      *(uint16_t *)((long)in_RDI + 0x1a) = uVar1;
      *(undefined2 *)(in_RDI + 0x22) = 0xffff;
      in_RDI[0x1e] = 0;
      in_RDI[0x1f] = 0;
      *(undefined2 *)(in_RDI + 0x23) = 0xffff;
      local_4 = Wirehair_Success;
    }
    else {
      local_4 = Wirehair_BadInput_LargeN;
    }
  }
  return local_4;
}

Assistant:

WirehairResult Codec::ChooseMatrix(
    uint64_t message_bytes,
    unsigned block_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ChooseMatrix ----" << endl << endl;)

    // Validate input
    if (message_bytes < 1 || block_bytes < 1) {
        return Wirehair_InvalidInput;
    }

    // Calculate message block count
    _block_bytes = block_bytes;
    _block_count = static_cast<uint16_t>((message_bytes + _block_bytes - 1) / _block_bytes);
    _block_next_prime = NextPrime16(_block_count);

    // Validate block count
    if (_block_count < CAT_WIREHAIR_MIN_N) {
        return Wirehair_BadInput_SmallN;
    }
    if (_block_count > CAT_WIREHAIR_MAX_N) {
        return Wirehair_BadInput_LargeN;
    }

    CAT_IF_DUMP(cout << "Total message = " << message_bytes << " bytes.  Block bytes = " << _block_bytes << endl;)
    CAT_IF_DUMP(cout << "Block count = " << _block_count << " +Prime=" << _block_next_prime << endl;)

    if (!_seed_override)
    {
        // Pick dense row count, dense row seed, and peel row seed
        _dense_count = GetDenseCount(_block_count);
        _d_seed = GetDenseSeed(_block_count, _dense_count);
        _p_seed = GetPeelSeed(_block_count);
    }

    CAT_IF_DUMP(cout << "Peel seed = " << _p_seed << "  Dense seed = " << _d_seed << endl;)

    _mix_count = _dense_count + kHeavyRows;
    _mix_next_prime = NextPrime16(_mix_count);

    CAT_IF_DUMP(cout << "Mix count = " << _mix_count << " +Prime=" << _mix_next_prime << endl;)

    // Initialize lists
    _peel_head_rows = LIST_TERM;
    _peel_tail_rows = 0;
    _defer_head_rows = LIST_TERM;

    return Wirehair_Success;
}